

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O2

void __thiscall
deqp::gls::VarSpec::set<3,3>
          (VarSpec *this,Matrix<float,_3,_3> *minValue_,Matrix<float,_3,_3> *maxValue_)

{
  DataType DVar1;
  
  DVar1 = glu::getDataTypeMatrix(3,3);
  this->type = DVar1;
  matToArr<3,3,16>(minValue_,(float (*) [16])&this->minValue);
  matToArr<3,3,16>(maxValue_,(float (*) [16])&this->maxValue);
  return;
}

Assistant:

void set (const tcu::Matrix<float, ValRows, ValCols>& minValue_, const tcu::Matrix<float, ValRows, ValCols>& maxValue_)
	{
		type = glu::getDataTypeMatrix(ValCols, ValRows);
		matToArr(minValue_, minValue.f);
		matToArr(maxValue_, maxValue.f);
	}